

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

FederateState * __thiscall
helics::CommonCore::getFederateAt(CommonCore *this,LocalFederateId federateID)

{
  MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  FederateState *pFVar1;
  shared_handle feds;
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  *in_stack_ffffffffffffffa8;
  shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  *this_01;
  shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  local_28;
  LocalFederateId local_4;
  
  this_01 = &local_28;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::lock(in_stack_ffffffffffffffa8);
  this_00 = gmlc::libguarded::
            shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
            ::operator*(this_01);
  LocalFederateId::baseValue(&local_4);
  pFVar1 = gmlc::containers::
           MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](this_00,(size_t)this_01);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
              *)0x461999);
  return pFVar1;
}

Assistant:

FederateState* CommonCore::getFederateAt(LocalFederateId federateID) const
{
    auto feds = federates.lock();
    return (*feds)[federateID.baseValue()];
}